

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# coded_stream.cc
# Opt level: O0

uint8_t * __thiscall
google::protobuf::io::EpsCopyOutputStream::EnsureSpaceFallback
          (EpsCopyOutputStream *this,uint8_t *ptr)

{
  LogMessage *pLVar1;
  LogFinisher local_f2;
  byte local_f1;
  LogMessage local_f0;
  LogFinisher local_b2;
  byte local_b1;
  LogMessage local_b0;
  LogFinisher local_75 [20];
  byte local_61;
  LogMessage local_60;
  int local_24;
  uint8_t *puStack_20;
  int overrun;
  uint8_t *ptr_local;
  EpsCopyOutputStream *this_local;
  
  puStack_20 = ptr;
  ptr_local = (uint8_t *)this;
  do {
    if ((this->had_error_ & 1U) != 0) {
      return this->buffer_;
    }
    local_24 = (int)puStack_20 - (int)this->end_;
    local_61 = 0;
    if (local_24 < 0) {
      internal::LogMessage::LogMessage
                (&local_60,LOGLEVEL_DFATAL,
                 "/workspace/llm4binary/github/license_c_cmakelists/apple[P]coremltools/deps/protobuf/src/google/protobuf/io/coded_stream.cc"
                 ,0x33d);
      local_61 = 1;
      pLVar1 = internal::LogMessage::operator<<(&local_60,"CHECK failed: overrun >= 0: ");
      internal::LogFinisher::operator=(local_75,pLVar1);
    }
    if ((local_61 & 1) != 0) {
      internal::LogMessage::~LogMessage(&local_60);
    }
    local_b1 = 0;
    if (0x10 < local_24) {
      internal::LogMessage::LogMessage
                (&local_b0,LOGLEVEL_DFATAL,
                 "/workspace/llm4binary/github/license_c_cmakelists/apple[P]coremltools/deps/protobuf/src/google/protobuf/io/coded_stream.cc"
                 ,0x33e);
      local_b1 = 1;
      pLVar1 = internal::LogMessage::operator<<(&local_b0,"CHECK failed: overrun <= kSlopBytes: ");
      internal::LogFinisher::operator=(&local_b2,pLVar1);
    }
    if ((local_b1 & 1) != 0) {
      internal::LogMessage::~LogMessage(&local_b0);
    }
    puStack_20 = Next(this);
    puStack_20 = puStack_20 + local_24;
  } while (this->end_ <= puStack_20);
  local_f1 = 0;
  if (this->end_ <= puStack_20) {
    internal::LogMessage::LogMessage
              (&local_f0,LOGLEVEL_DFATAL,
               "/workspace/llm4binary/github/license_c_cmakelists/apple[P]coremltools/deps/protobuf/src/google/protobuf/io/coded_stream.cc"
               ,0x341);
    local_f1 = 1;
    pLVar1 = internal::LogMessage::operator<<(&local_f0,"CHECK failed: ptr < end_: ");
    internal::LogFinisher::operator=(&local_f2,pLVar1);
  }
  if ((local_f1 & 1) != 0) {
    internal::LogMessage::~LogMessage(&local_f0);
  }
  return puStack_20;
}

Assistant:

uint8_t* EpsCopyOutputStream::EnsureSpaceFallback(uint8_t* ptr) {
  do {
    if (PROTOBUF_PREDICT_FALSE(had_error_)) return buffer_;
    int overrun = ptr - end_;
    GOOGLE_DCHECK(overrun >= 0);           // NOLINT
    GOOGLE_DCHECK(overrun <= kSlopBytes);  // NOLINT
    ptr = Next() + overrun;
  } while (ptr >= end_);
  GOOGLE_DCHECK(ptr < end_);  // NOLINT
  return ptr;
}